

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWeakSetPrototype
               (DynamicObject *weakSetPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *weakSetPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,weakSetPrototype,mode,5,0);
  this = RecyclableObject::GetScriptContext(&weakSetPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&weakSetPrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).weakSetConstructor
                      );
  AddMember(this_00,weakSetPrototype,0x67,*ppRVar2);
  AddFunctionToLibraryObject
            (this_00,weakSetPrototype,0x4a,(FunctionInfo *)JavascriptWeakSet::EntryInfo::Add,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,weakSetPrototype,0x6f,(FunctionInfo *)JavascriptWeakSet::EntryInfo::Delete,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,weakSetPrototype,0xb4,(FunctionInfo *)JavascriptWeakSet::EntryInfo::Has,1,
             '\x06');
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<8ul>(this_00,(char16 (*) [8])L"WeakSet");
    AddMember(this_00,weakSetPrototype,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(weakSetPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakSetPrototype(DynamicObject* weakSetPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakSetPrototype, mode, 5);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakSet
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = weakSetPrototype->GetScriptContext();
        JavascriptLibrary* library = weakSetPrototype->GetLibrary();
        library->AddMember(weakSetPrototype, PropertyIds::constructor, library->weakSetConstructor);

        library->AddFunctionToLibraryObject(weakSetPrototype, PropertyIds::add, &JavascriptWeakSet::EntryInfo::Add, 1);
        library->AddFunctionToLibraryObject(weakSetPrototype, PropertyIds::delete_, &JavascriptWeakSet::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(weakSetPrototype, PropertyIds::has, &JavascriptWeakSet::EntryInfo::Has, 1);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(weakSetPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WeakSet")), PropertyConfigurable);
        }

        weakSetPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }